

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

void set_object_name(JSParseState *s,JSAtom name)

{
  JSFunctionDef *fd_00;
  int iVar1;
  JSAtom JVar2;
  uint32_t uVar3;
  int iVar4;
  uint8_t *tab;
  long in_RDI;
  JSAtom atom;
  int define_class_pos;
  int opcode;
  JSFunctionDef *fd;
  JSAtom in_stack_ffffffffffffffcc;
  JSContext *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffdc;
  uint8_t val;
  undefined4 in_stack_ffffffffffffffe0;
  
  val = (uint8_t)((uint)in_stack_ffffffffffffffdc >> 0x18);
  fd_00 = *(JSFunctionDef **)(in_RDI + 0x68);
  iVar1 = get_prev_opcode(fd_00);
  if (iVar1 == 0x4d) {
    (fd_00->byte_code).size = (long)fd_00->last_opcode_pos;
    fd_00->last_opcode_pos = -1;
    emit_op((JSParseState *)CONCAT44(0x4d,in_stack_ffffffffffffffe0),val);
    emit_atom((JSParseState *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  }
  else if (iVar1 == 0xbf) {
    JVar2 = fd_00->last_opcode_pos + 1;
    uVar3 = get_u32((fd_00->byte_code).buf + (long)fd_00->last_opcode_pos + 1);
    iVar4 = JVar2 - uVar3;
    uVar3 = get_u32((fd_00->byte_code).buf + (long)iVar4 + 1);
    JS_FreeAtom(in_stack_ffffffffffffffd0,JVar2);
    tab = (fd_00->byte_code).buf + (long)iVar4 + 1;
    JVar2 = JS_DupAtom((JSContext *)CONCAT44(iVar1,iVar4),uVar3);
    put_u32(tab,JVar2);
    fd_00->last_opcode_pos = -1;
  }
  return;
}

Assistant:

static void set_object_name(JSParseState *s, JSAtom name)
{
    JSFunctionDef *fd = s->cur_func;
    int opcode;

    opcode = get_prev_opcode(fd);
    if (opcode == OP_set_name) {
        /* XXX: should free atom after OP_set_name? */
        fd->byte_code.size = fd->last_opcode_pos;
        fd->last_opcode_pos = -1;
        emit_op(s, OP_set_name);
        emit_atom(s, name);
    } else if (opcode == OP_set_class_name) {
        int define_class_pos;
        JSAtom atom;
        define_class_pos = fd->last_opcode_pos + 1 -
            get_u32(fd->byte_code.buf + fd->last_opcode_pos + 1);
        assert(fd->byte_code.buf[define_class_pos] == OP_define_class);
        /* for consistency we free the previous atom which is
           JS_ATOM_empty_string */
        atom = get_u32(fd->byte_code.buf + define_class_pos + 1);
        JS_FreeAtom(s->ctx, atom);
        put_u32(fd->byte_code.buf + define_class_pos + 1,
                JS_DupAtom(s->ctx, name));
        fd->last_opcode_pos = -1;
    }
}